

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O3

int mbedtls_mpi_shrink(mbedtls_mpi *X,size_t nblimbs)

{
  ushort uVar1;
  mbedtls_mpi_uint *__src;
  ulong uVar2;
  int iVar3;
  mbedtls_mpi_uint *__dest;
  ulong uVar4;
  
  iVar3 = -0x10;
  if (nblimbs < 0x2711) {
    uVar1 = X->n;
    uVar2 = (ulong)uVar1;
    if (uVar1 <= nblimbs) {
      iVar3 = mbedtls_mpi_grow(X,nblimbs);
      return iVar3;
    }
    do {
      uVar4 = uVar2;
      if (uVar4 == 1) break;
      uVar2 = uVar4 - 1;
    } while (X->p[uVar4 - 1] == 0);
    if (nblimbs < uVar4) {
      nblimbs = uVar4;
    }
    __dest = (mbedtls_mpi_uint *)calloc(nblimbs,8);
    if (__dest != (mbedtls_mpi_uint *)0x0) {
      __src = X->p;
      if (__src != (mbedtls_mpi_uint *)0x0) {
        switchD_00b041bd::default(__dest,__src,nblimbs * 8);
        mbedtls_zeroize_and_free(__src,(ulong)uVar1 << 3);
      }
      X->n = (unsigned_short)nblimbs;
      X->p = __dest;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_shrink(mbedtls_mpi *X, size_t nblimbs)
{
    mbedtls_mpi_uint *p;
    size_t i;

    if (nblimbs > MBEDTLS_MPI_MAX_LIMBS) {
        return MBEDTLS_ERR_MPI_ALLOC_FAILED;
    }

    /* Actually resize up if there are currently fewer than nblimbs limbs. */
    if (X->n <= nblimbs) {
        return mbedtls_mpi_grow(X, nblimbs);
    }
    /* After this point, then X->n > nblimbs and in particular X->n > 0. */

    for (i = X->n - 1; i > 0; i--) {
        if (X->p[i] != 0) {
            break;
        }
    }
    i++;

    if (i < nblimbs) {
        i = nblimbs;
    }

    if ((p = (mbedtls_mpi_uint *) mbedtls_calloc(i, ciL)) == NULL) {
        return MBEDTLS_ERR_MPI_ALLOC_FAILED;
    }

    if (X->p != NULL) {
        memcpy(p, X->p, i * ciL);
        mbedtls_mpi_zeroize_and_free(X->p, X->n);
    }

    /* i fits in n because we ensure that MBEDTLS_MPI_MAX_LIMBS
     * fits, and we've checked that i <= nblimbs <= MBEDTLS_MPI_MAX_LIMBS. */
    X->n = (unsigned short) i;
    X->p = p;

    return 0;
}